

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_353748f::DumpVisitor::onStartDIE(DumpVisitor *this,Unit *CU,Entry *DIE)

{
  uint32_t *puVar1;
  Entry *DIE_local;
  Unit *CU_local;
  DumpVisitor *this_local;
  
  puVar1 = llvm::yaml::Hex32::operator_cast_to_unsigned_int_(&DIE->AbbrCode);
  llvm::encodeULEB128((ulong)*puVar1,this->OS,0);
  return;
}

Assistant:

void onStartDIE(const DWARFYAML::Unit &CU,
                  const DWARFYAML::Entry &DIE) override {
    encodeULEB128(DIE.AbbrCode, OS);
  }